

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

bool AreCompatiblePointerTypes(PType *dest,PType *source,bool forcompare)

{
  PClass *ti;
  PClass *this;
  bool bVar1;
  PClass *tocls;
  PClass *fromcls;
  PPointer *totype;
  PPointer *fromtype;
  bool forcompare_local;
  PType *source_local;
  PType *dest_local;
  
  bVar1 = DObject::IsKindOf((DObject *)dest,PPointer::RegistrationInfo.MyClass);
  if ((bVar1) &&
     (bVar1 = DObject::IsKindOf((DObject *)source,PPointer::RegistrationInfo.MyClass), bVar1)) {
    if (source == (PType *)0x0) {
      return true;
    }
    if ((!forcompare) &&
       ((*(byte *)&dest[1].super_PTypeBase.super_DObject.Class & 1) !=
        (*(byte *)&source[1].super_PTypeBase.super_DObject.Class & 1))) {
      return false;
    }
    if (source == dest) {
      return true;
    }
    bVar1 = DObject::IsKindOf((DObject *)source[1].super_PTypeBase.super_DObject._vptr_DObject,
                              PClass::RegistrationInfo.MyClass);
    if ((bVar1) &&
       (bVar1 = DObject::IsKindOf((DObject *)dest[1].super_PTypeBase.super_DObject._vptr_DObject,
                                  PClass::RegistrationInfo.MyClass), bVar1)) {
      ti = (PClass *)source[1].super_PTypeBase.super_DObject._vptr_DObject;
      this = (PClass *)dest[1].super_PTypeBase.super_DObject._vptr_DObject;
      if ((forcompare) && (bVar1 = PClass::IsDescendantOf(this,ti), bVar1)) {
        return true;
      }
      bVar1 = PClass::IsDescendantOf(ti,this);
      return bVar1;
    }
  }
  return false;
}

Assistant:

static bool AreCompatiblePointerTypes(PType *dest, PType *source, bool forcompare = false)
{
	if (dest->IsKindOf(RUNTIME_CLASS(PPointer)) && source->IsKindOf(RUNTIME_CLASS(PPointer)))
	{
		// Pointers to different types are only compatible if both point to an object and the source type is a child of the destination type.
		auto fromtype = static_cast<PPointer *>(source);
		auto totype = static_cast<PPointer *>(dest);
		if (fromtype == nullptr) return true;
		if (!forcompare && totype->IsConst != fromtype->IsConst) return false;
		if (fromtype == totype) return true;
		if (fromtype->PointedType->IsKindOf(RUNTIME_CLASS(PClass)) && totype->PointedType->IsKindOf(RUNTIME_CLASS(PClass)))
		{
			auto fromcls = static_cast<PClass *>(fromtype->PointedType);
			auto tocls = static_cast<PClass *>(totype->PointedType);
			if (forcompare && tocls->IsDescendantOf(fromcls)) return true;
			return (fromcls->IsDescendantOf(tocls));
		}
	}
	return false;
}